

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool __thiscall
CLIntercept::checkRelaxAllocationLimitsSupport
          (CLIntercept *this,cl_uint numDevices,cl_device_id *deviceList)

{
  uint uVar1;
  cl_icd_dispatch *pcVar2;
  long in_RDX;
  uint in_ESI;
  CLIntercept *in_RDI;
  cl_uint deviceVendorId;
  cl_device_type deviceType;
  cl_uint i;
  bool supported;
  cl_int errorCode;
  byte local_41;
  int local_34;
  ulong local_30;
  uint local_24;
  byte local_1d;
  uint local_1c;
  long local_18;
  uint local_c;
  
  local_1c = 0;
  local_1d = 1;
  local_24 = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  do {
    if (local_c <= local_24) {
LAB_002130f8:
      local_41 = 0;
      if (local_1c == 0) {
        local_41 = local_1d;
      }
      return (bool)(local_41 & 1);
    }
    local_30 = 0;
    pcVar2 = dispatch(in_RDI);
    uVar1 = (*pcVar2->clGetDeviceInfo)
                      (*(cl_device_id *)(local_18 + (ulong)local_24 * 8),0x1000,8,&local_30,
                       (size_t *)0x0);
    local_1c = uVar1 | local_1c;
    pcVar2 = dispatch(in_RDI);
    uVar1 = (*pcVar2->clGetDeviceInfo)
                      (*(cl_device_id *)(local_18 + (ulong)local_24 * 8),0x1001,4,&local_34,
                       (size_t *)0x0);
    local_1c = uVar1 | local_1c;
    if (((local_30 & 4) == 0) || (local_34 != 0x8086)) {
      local_1d = 0;
      goto LAB_002130f8;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_uint numDevices,
    const cl_device_id* deviceList ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    // For now, check for Intel GPU devices to determine whether relaxed
    // allocations are supported.  Eventually this can be checked using
    // formal mechanisms.

    for( cl_uint i = 0; i < numDevices; i++ )
    {
        cl_device_type  deviceType = 0;
        cl_uint deviceVendorId;

        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_TYPE,
            sizeof( deviceType ),
            &deviceType,
            NULL );
        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_VENDOR_ID,
            sizeof( deviceVendorId ),
            &deviceVendorId,
            NULL );
        if( ( deviceType & CL_DEVICE_TYPE_GPU ) == 0 ||
            deviceVendorId != 0x8086 )
        {
            supported = false;
            break;
        }
    }

    return ( errorCode == CL_SUCCESS ) && supported;
}